

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O0

sbfRequestImpl *
sbfRequestPub_send(sbfRequestPub_conflict pub,void *data,size_t size,sbfRequestPubReplyCb replyCb,
                  void *closure)

{
  sbfBuffer_conflict buffer_00;
  void *pvVar1;
  sbfRequestTreeImpl *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  sbfRequestPub_conflict in_RDI;
  sbfRequestImpl *in_R8;
  sbfRequestHeader *hdr;
  sbfBuffer_conflict buffer;
  sbfRequest req;
  sbfRequestImpl *local_8;
  
  if ((in_RDI->mPubReady == 0) || (in_RDI->mSubReady == 0)) {
    local_8 = (sbfRequestImpl *)0x0;
  }
  else {
    local_8 = (sbfRequestImpl *)sbfMemory_calloc(1,0x68);
    local_8->mPub = in_RDI;
    sbfRefCount_init(&local_8->mRefCount,1);
    local_8->mReplyCb = (sbfRequestPubReplyCb)in_RCX;
    local_8->mClosure = in_R8;
    sbfGuid_increment(&in_RDI->mNext,1);
    sbfGuid_copy(&local_8->mGuid,&in_RDI->mNext);
    sbfRequestTreeImpl_RB_INSERT(in_RCX,in_R8);
    buffer_00 = (sbfBuffer_conflict)sbfPub_getBuffer(in_RDI->mPub,in_RDX + 0x40);
    pvVar1 = sbfBuffer_getData(buffer_00);
    sbfGuid_copy(pvVar1);
    memset((void *)((long)pvVar1 + 0x20),0,0x20);
    memcpy((void *)((long)pvVar1 + 0x40),in_RSI,in_RDX);
    sbfPub_sendBuffer(in_RDI->mPub,buffer_00);
  }
  return local_8;
}

Assistant:

sbfRequest
sbfRequestPub_send (sbfRequestPub pub,
                    void* data,
                    size_t size,
                    sbfRequestPubReplyCb replyCb,
                    void* closure)
{
    sbfRequest        req;
    sbfBuffer         buffer;
    sbfRequestHeader* hdr;

    if (!pub->mPubReady || !pub->mSubReady)
        return NULL;

    req = xcalloc (1, sizeof *req);
    req->mPub = pub;
    sbfRefCount_init (&req->mRefCount, 1);

    req->mReplyCb = replyCb;
    req->mClosure = closure;

    sbfGuid_increment (&pub->mNext, 1);
    sbfGuid_copy (&req->mGuid, &pub->mNext);

    RB_INSERT (sbfRequestTreeImpl, &pub->mRequests, req);

    buffer = sbfPub_getBuffer (pub->mPub, size + sizeof *hdr);

    hdr = sbfBuffer_getData (buffer);
    sbfGuid_copy (&hdr->mGuid, &req->mGuid);
    memset (hdr->mSpace, 0, sizeof hdr->mSpace);

    memcpy (hdr + 1, data, size);
    sbfPub_sendBuffer (pub->mPub, buffer);

    return req;
}